

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# belt_cbc.c
# Opt level: O0

void beltCBCStepE(void *buf,size_t count,void *state)

{
  u32 *in_RDX;
  ulong in_RSI;
  ulong *in_RDI;
  belt_cbc_st *st;
  ulong local_10;
  ulong *local_8;
  
  local_8 = in_RDI;
  for (local_10 = in_RSI; 0xf < local_10; local_10 = local_10 - 0x10) {
    *(ulong *)(in_RDX + 8) = *local_8 ^ *(ulong *)(in_RDX + 8);
    *(ulong *)(in_RDX + 10) = local_8[1] ^ *(ulong *)(in_RDX + 10);
    beltBlockEncr((octet *)(in_RDX + 8),in_RDX);
    *local_8 = *(ulong *)(in_RDX + 8);
    local_8[1] = *(ulong *)(in_RDX + 10);
    local_8 = local_8 + 2;
  }
  if (local_10 != 0) {
    memSwap(local_8 + -2,local_8,local_10);
    memXor2(local_8 + -2,in_RDX + 8,local_10);
    beltBlockEncr((octet *)(local_8 + -2),in_RDX);
  }
  return;
}

Assistant:

void beltCBCStepE(void* buf, size_t count, void* state)
{
	belt_cbc_st* st = (belt_cbc_st*)state;
	ASSERT(count >= 16);
	ASSERT(memIsDisjoint2(buf, count, state, beltCBC_keep()));
	// цикл по полным блокам
	while(count >= 16)
	{
		beltBlockXor2(st->block, buf);
		beltBlockEncr(st->block, st->key);
		beltBlockCopy(buf, st->block);
		buf = (octet*)buf + 16;
		count -= 16;
	}
	// неполный блок? кража блока
	if (count)
	{
		memSwap((octet*)buf - 16, buf, count);
		memXor2((octet*)buf - 16, st->block, count);
		beltBlockEncr((octet*)buf - 16, st->key);
	}
}